

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall
spdlog::details::registry::initialize_logger(registry *this,shared_ptr<spdlog::logger> *new_logger)

{
  level_enum lVar1;
  element_type *new_logger_00;
  pointer pfVar2;
  string *logger_name;
  element_type *this_00;
  log_levels *this_01;
  long in_RDI;
  lock_guard<std::mutex> lock;
  err_handler *in_stack_ffffffffffffff48;
  logger *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff60;
  registry *in_stack_ffffffffffffffa0;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_stack_ffffffffffffffb8;
  logger *in_stack_ffffffffffffffc0;
  undefined1 local_20 [32];
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff50,
             (mutex_type *)in_stack_ffffffffffffff48);
  new_logger_00 =
       std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
       operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  0x1a07e0);
  pfVar2 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x1a07f6);
  (*pfVar2->_vptr_formatter[3])(local_20);
  logger::set_formatter(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             in_stack_ffffffffffffff50);
  if (*(long *)(in_RDI + 0x100) != 0) {
    std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a084a);
    std::function<void(std::__cxx11::string_const&)>::
    function<void(*&)(std::__cxx11::string_const&),void>
              (in_stack_ffffffffffffff60,
               (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    logger::set_error_handler(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)0x1a0885);
  }
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1a08f3);
  logger_name = (string *)(in_RDI + 0xb0);
  this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a0915);
  this_01 = (log_levels *)logger::name_abi_cxx11_(this_00);
  lVar1 = cfg::log_levels::get(this_01,logger_name);
  logger::set_level((logger *)CONCAT44(lVar1,in_stack_ffffffffffffff58),
                    (level_enum)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1a0953);
  logger::flush_on((logger *)CONCAT44(lVar1,in_stack_ffffffffffffff58),
                   (level_enum)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  if (*(long *)(in_RDI + 0x138) != 0) {
    std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a0981);
    logger::enable_backtrace(in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
  }
  if ((*(byte *)(in_RDI + 0x130) & 1) != 0) {
    std::shared_ptr<spdlog::logger>::shared_ptr
              ((shared_ptr<spdlog::logger> *)&stack0xffffffffffffffa0,
               (shared_ptr<spdlog::logger> *)in_stack_ffffffffffffff48);
    register_logger_(in_stack_ffffffffffffffa0,(shared_ptr<spdlog::logger> *)new_logger_00);
    std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x1a09d6);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1a0a05);
  return;
}

Assistant:

SPDLOG_INLINE void registry::initialize_logger(std::shared_ptr<logger> new_logger)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    new_logger->set_formatter(formatter_->clone());

    if (err_handler_)
    {
        new_logger->set_error_handler(err_handler_);
    }

    new_logger->set_level(levels_.get(new_logger->name()));
    new_logger->flush_on(flush_level_);

    if (backtrace_n_messages_ > 0)
    {
        new_logger->enable_backtrace(backtrace_n_messages_);
    }

    if (automatic_registration_)
    {
        register_logger_(std::move(new_logger));
    }
}